

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O1

uint32_t __thiscall
icu_63::CollationBuilder::addOnlyClosure
          (CollationBuilder *this,UnicodeString *nfdPrefix,UnicodeString *nfdString,int64_t *newCEs,
          int32_t newCEsLength,uint32_t ce32,UErrorCode *errorCode)

{
  short sVar1;
  UBool UVar2;
  int iVar3;
  uint32_t uVar4;
  undefined4 uVar5;
  ulong uVar6;
  int32_t iVar7;
  char cVar8;
  bool bVar9;
  bool bVar10;
  UnicodeString prefix;
  UnicodeString str;
  CanonicalIterator stringIter;
  CanonicalIterator prefixIter;
  uint32_t local_264;
  UnicodeString local_240;
  UnicodeString local_200;
  undefined1 local_1c0 [200];
  CanonicalIterator local_f8;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar4 = ce32;
    if ((ushort)(nfdPrefix->fUnion).fStackFields.fLengthAndFlags < 0x20) {
      CanonicalIterator::CanonicalIterator(&local_f8,nfdString,errorCode);
      if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        local_1c0._0_8_ = &PTR__UnicodeString_003b5258;
        local_1c0._8_2_ = 2;
        CanonicalIterator::next(&local_240,&local_f8);
        uVar6 = 2;
        if ((local_240.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
          UVar2 = ignoreString(this,&local_240,errorCode);
          uVar6 = 3;
          if (UVar2 == '\0') {
            if ((local_240.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
              if (-1 < local_240.fUnion.fStackFields.fLengthAndFlags) {
                local_240.fUnion.fFields.fLength =
                     (int)local_240.fUnion.fStackFields.fLengthAndFlags >> 5;
              }
              sVar1 = (nfdString->fUnion).fStackFields.fLengthAndFlags;
              if (sVar1 < 0) {
                iVar7 = (nfdString->fUnion).fFields.fLength;
              }
              else {
                iVar7 = (int)sVar1 >> 5;
              }
              bVar10 = false;
              if ((((int)sVar1 & 1U) == 0) &&
                 (bVar10 = false, local_240.fUnion.fFields.fLength == iVar7)) {
                UVar2 = UnicodeString::doEquals
                                  (&local_240,nfdString,local_240.fUnion.fFields.fLength);
                bVar10 = UVar2 != '\0';
              }
            }
            else {
              bVar10 = (bool)(*(byte *)&nfdString->fUnion & 1);
            }
            if (bVar10 == false) {
              addIfDifferent(this,(UnicodeString *)local_1c0,&local_240,newCEs,newCEsLength,ce32,
                             errorCode);
              uVar6 = (ulong)(U_ZERO_ERROR < *errorCode);
            }
          }
        }
        UnicodeString::~UnicodeString(&local_240);
        uVar4 = (*(code *)(&DAT_002f59d0 + *(int *)(&DAT_002f59d0 + uVar6 * 4)))();
        return uVar4;
      }
      bVar10 = false;
    }
    else {
      CanonicalIterator::CanonicalIterator(&local_f8,nfdPrefix,errorCode);
      CanonicalIterator::CanonicalIterator((CanonicalIterator *)local_1c0,nfdString,errorCode);
      if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        do {
          CanonicalIterator::next(&local_240,&local_f8);
          cVar8 = '\x04';
          if ((((local_240.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) &&
              (cVar8 = '\x05', *errorCode < U_ILLEGAL_ARGUMENT_ERROR)) &&
             (iVar3 = (*(this->fcd->super_UObject)._vptr_UObject[0xb])
                                (this->fcd,&local_240,errorCode), (char)iVar3 != '\0')) {
            if ((local_240.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
              uVar5 = local_240.fUnion.fFields.fLength;
              if (-1 < local_240.fUnion.fStackFields.fLengthAndFlags) {
                uVar5 = (int)local_240.fUnion.fStackFields.fLengthAndFlags >> 5;
              }
              sVar1 = (nfdPrefix->fUnion).fStackFields.fLengthAndFlags;
              if (sVar1 < 0) {
                iVar3 = (nfdPrefix->fUnion).fFields.fLength;
              }
              else {
                iVar3 = (int)sVar1 >> 5;
              }
              bVar10 = false;
              if ((((int)sVar1 & 1U) == 0) && (uVar5 == iVar3)) {
                UVar2 = UnicodeString::doEquals(&local_240,nfdPrefix,uVar5);
                bVar10 = UVar2 != '\0';
              }
            }
            else {
              bVar10 = (bool)(*(byte *)&nfdPrefix->fUnion & 1);
            }
            do {
              CanonicalIterator::next(&local_200,(CanonicalIterator *)local_1c0);
              cVar8 = '\x06';
              if ((local_200.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
                UVar2 = ignoreString(this,&local_200,errorCode);
                cVar8 = '\a';
                if (UVar2 == '\0') {
                  if (bVar10 != false) {
                    if ((local_200.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
                      uVar5 = local_200.fUnion.fFields.fLength;
                      if (-1 < local_200.fUnion.fStackFields.fLengthAndFlags) {
                        uVar5 = (int)local_200.fUnion.fStackFields.fLengthAndFlags >> 5;
                      }
                      sVar1 = (nfdString->fUnion).fStackFields.fLengthAndFlags;
                      if (sVar1 < 0) {
                        iVar7 = (nfdString->fUnion).fFields.fLength;
                      }
                      else {
                        iVar7 = (int)sVar1 >> 5;
                      }
                      bVar9 = false;
                      if ((((int)sVar1 & 1U) == 0) && (bVar9 = false, uVar5 == iVar7)) {
                        UVar2 = UnicodeString::doEquals(&local_200,nfdString,uVar5);
                        bVar9 = UVar2 != '\0';
                      }
                    }
                    else {
                      bVar9 = (bool)(*(byte *)&nfdString->fUnion & 1);
                    }
                    if (bVar9 != false) goto LAB_002286bf;
                  }
                  uVar4 = addIfDifferent(this,&local_240,&local_200,newCEs,newCEsLength,uVar4,
                                         errorCode);
                  cVar8 = U_ZERO_ERROR < *errorCode;
                  if (U_ZERO_ERROR < *errorCode) {
                    local_264 = uVar4;
                  }
                }
              }
LAB_002286bf:
              UnicodeString::~UnicodeString(&local_200);
            } while ((cVar8 == '\0') || (cVar8 == '\a'));
            if (cVar8 == '\x06') {
              cVar8 = '\0';
              CanonicalIterator::reset((CanonicalIterator *)local_1c0);
            }
          }
          UnicodeString::~UnicodeString(&local_240);
        } while ((cVar8 == '\0') || (cVar8 == '\x05'));
        bVar10 = cVar8 == '\x04';
        ce32 = local_264;
      }
      else {
        bVar10 = false;
      }
      CanonicalIterator::~CanonicalIterator((CanonicalIterator *)local_1c0);
    }
    CanonicalIterator::~CanonicalIterator(&local_f8);
    if (bVar10) {
      ce32 = uVar4;
    }
  }
  return ce32;
}

Assistant:

uint32_t
CollationBuilder::addOnlyClosure(const UnicodeString &nfdPrefix, const UnicodeString &nfdString,
                                 const int64_t newCEs[], int32_t newCEsLength, uint32_t ce32,
                                 UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return ce32; }

    // Map from canonically equivalent input to the CEs. (But not from the all-NFD input.)
    if(nfdPrefix.isEmpty()) {
        CanonicalIterator stringIter(nfdString, errorCode);
        if(U_FAILURE(errorCode)) { return ce32; }
        UnicodeString prefix;
        for(;;) {
            UnicodeString str = stringIter.next();
            if(str.isBogus()) { break; }
            if(ignoreString(str, errorCode) || str == nfdString) { continue; }
            ce32 = addIfDifferent(prefix, str, newCEs, newCEsLength, ce32, errorCode);
            if(U_FAILURE(errorCode)) { return ce32; }
        }
    } else {
        CanonicalIterator prefixIter(nfdPrefix, errorCode);
        CanonicalIterator stringIter(nfdString, errorCode);
        if(U_FAILURE(errorCode)) { return ce32; }
        for(;;) {
            UnicodeString prefix = prefixIter.next();
            if(prefix.isBogus()) { break; }
            if(ignorePrefix(prefix, errorCode)) { continue; }
            UBool samePrefix = prefix == nfdPrefix;
            for(;;) {
                UnicodeString str = stringIter.next();
                if(str.isBogus()) { break; }
                if(ignoreString(str, errorCode) || (samePrefix && str == nfdString)) { continue; }
                ce32 = addIfDifferent(prefix, str, newCEs, newCEsLength, ce32, errorCode);
                if(U_FAILURE(errorCode)) { return ce32; }
            }
            stringIter.reset();
        }
    }
    return ce32;
}